

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_CreateIntArray(int *numbers,int count)

{
  cJSON *pcVar1;
  cJSON *item;
  cJSON *a;
  cJSON *p;
  cJSON *n;
  int i;
  int count_local;
  int *numbers_local;
  
  a = (cJSON *)0x0;
  pcVar1 = cJSON_CreateArray();
  for (n._0_4_ = 0; pcVar1 != (cJSON *)0x0 && (int)n < count; n._0_4_ = (int)n + 1) {
    item = cJSON_CreateNumber((double)numbers[(int)n]);
    if ((int)n == 0) {
      pcVar1->child = item;
    }
    else {
      suffix_object(a,item);
    }
    a = item;
  }
  return pcVar1;
}

Assistant:

cJSON *cJSON_CreateIntArray(const int *numbers,int count)		{int i;cJSON *n=0,*p=0,*a=cJSON_CreateArray();for(i=0;a && i<count;i++){n=cJSON_CreateNumber(numbers[i]);if(!i)a->child=n;else suffix_object(p,n);p=n;}return a;}